

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

tribool __thiscall
libtorrent::aux::torrent::on_blocks_hashed
          (torrent *this,piece_index_t piece,span<const_libtorrent::digest32<256L>_> block_hashes)

{
  long lVar1;
  set_block_hash_result sVar2;
  set_block_hash_result sVar3;
  set_block_hash_result sVar4;
  span<bool> *psVar5;
  vector<int,_std::allocator<int>_> *blocks;
  int iVar6;
  hash_picker *this_00;
  torrent *ptVar7;
  piece_index_t pVar8;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar9;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar10;
  undefined8 uVar11;
  tribool tVar12;
  bool bVar13;
  int iVar14;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar15;
  torrent_info *ptVar16;
  file_storage *this_01;
  long lVar17;
  unsigned_long uVar18;
  bool *pbVar19;
  bool *pbVar20;
  digest32<256L> *pdVar21;
  pointer ppVar22;
  span<bool> **p;
  torrent_hot_members *ptVar23;
  set_block_hash_result sVar24;
  undefined8 uStack_250;
  span<bool> *local_248;
  bool *local_240;
  undefined1 local_235;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_234;
  vector<int,_std::allocator<int>_> *local_230;
  undefined1 local_222;
  undefined1 local_221;
  int local_220;
  undefined1 local_219;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_218;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_214;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_210;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_208;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  int local_200;
  undefined1 local_1f9;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1f8;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1f4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_1f0;
  int *local_1e8;
  int *local_1e0;
  result local_1d4;
  set_block_hash_result local_1d0;
  int local_1c4;
  digest32<256L> *local_1c0;
  hash_picker *local_1b8;
  digest32<256L> *local_1b0;
  span<bool> *local_1a8;
  bool *local_1a0;
  bool *local_198;
  torrent *local_190;
  tribool local_188 [2];
  value_t local_180;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_17c;
  vector<int,_std::allocator<int>_> local_178;
  piece_index_t local_160;
  int local_15c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_158;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_154;
  piece_index_t verified_piece_1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_148;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin3
  ;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range3;
  tribool local_128;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_110;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_10c;
  piece_index_t verified_piece;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_100;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end4;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin4
  ;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range4;
  int local_e0;
  int local_dc;
  int local_d8;
  int count;
  result rStack_d0;
  int first_block;
  result local_c8;
  piece_index_t local_c0;
  undefined1 local_bc [8];
  set_block_hash_result result;
  undefined1 auStack_a8 [4];
  int i;
  set_block_hash_result last_result;
  bool local_89;
  undefined1 local_88 [8];
  alloca_destructor<bool> block_passed_destructor;
  bool *local_70;
  bool *TORRENT_ALLOCA_tmp;
  bool *local_58;
  long local_50;
  long TORRENT_ALLOCA_size;
  span<bool> block_passed;
  int blocks_per_piece;
  tribool local_2c;
  int blocks_in_piece;
  tribool ret;
  torrent *this_local;
  span<const_libtorrent::digest32<256L>_> block_hashes_local;
  piece_index_t piece_local;
  
  block_hashes_local.m_ptr = (digest32<256L> *)block_hashes.m_len;
  this_local = (torrent *)block_hashes.m_ptr;
  p = &local_248;
  uStack_250 = 0x676255;
  local_190 = this;
  _blocks_in_piece = this;
  block_hashes_local.m_len._0_4_ = piece.m_val;
  boost::logic::tribool::tribool(&local_2c,boost::logic::indeterminate);
  uStack_250 = 0x676261;
  need_hash_picker(local_190);
  uStack_250 = 0x67626d;
  ptVar16 = torrent_file(local_190);
  uStack_250 = 0x676275;
  this_01 = torrent_info::orig_files(ptVar16);
  block_passed.m_len._4_4_ = block_hashes_local.m_len._0_4_;
  uStack_250 = 0x676286;
  iVar14 = file_storage::blocks_in_piece2(this_01,block_hashes_local.m_len._0_4_);
  uStack_250 = 0x676295;
  ptVar16 = torrent_file(local_190);
  uStack_250 = 0x67629d;
  block_passed.m_len._0_4_ = torrent_info::blocks_per_piece(ptVar16);
  uStack_250 = 0x6762ab;
  span<bool>::span((span<bool> *)&TORRENT_ALLOCA_size);
  uStack_250 = 0x6762b3;
  lVar17 = numeric_cast<long,int,void>(iVar14);
  local_50 = lVar17;
  if (lVar17 < 0x1001) {
    if (0 < iVar14) {
      lVar1 = -((long)iVar14 + 0xfU & 0xfffffffffffffff0);
      p = (span<bool> **)((long)&local_248 + lVar1);
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x676323;
      span<bool>::span((span<bool> *)&block_passed_destructor.objects.m_len,(bool *)p,lVar17);
      TORRENT_ALLOCA_size = block_passed_destructor.objects.m_len;
      block_passed.m_ptr = local_70;
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x67633c;
      local_198 = span<bool>::begin((span<bool> *)&TORRENT_ALLOCA_size);
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x67634c;
      pbVar20 = span<bool>::end((span<bool> *)&TORRENT_ALLOCA_size);
      pbVar19 = local_198;
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x67635b;
      uninitialized_default_construct<bool*>(pbVar19,pbVar20);
    }
  }
  else {
    uStack_250 = 0x6762c9;
    uVar18 = numeric_cast<unsigned_long,int,void>(iVar14);
    uStack_250 = 0x6762d1;
    pbVar19 = (bool *)operator_new__(uVar18);
    uStack_250 = 0x6762e1;
    span<bool>::span((span<bool> *)&TORRENT_ALLOCA_tmp,pbVar19,local_50);
    TORRENT_ALLOCA_size = (long)TORRENT_ALLOCA_tmp;
    block_passed.m_ptr = local_58;
    p = &local_248;
  }
  local_1a8 = (span<bool> *)&TORRENT_ALLOCA_size;
  *(bool *)((long)p + -8) = true;
  *(bool *)((long)p + -7) = true;
  *(bool *)((long)p + -6) = true;
  *(bool *)((long)p + -5) = false;
  *(bool *)((long)p + -4) = false;
  *(bool *)((long)p + -3) = false;
  *(bool *)((long)p + -2) = false;
  *(bool *)((long)p + -1) = false;
  span<bool>::span<libtorrent::span<bool>,bool,void>
            ((span<bool> *)local_88,(span<bool> *)&TORRENT_ALLOCA_size);
  psVar5 = local_1a8;
  *(bool *)((long)p + -8) = true;
  *(bool *)((long)p + -7) = true;
  *(bool *)((long)p + -6) = true;
  *(bool *)((long)p + -5) = false;
  *(bool *)((long)p + -4) = false;
  *(bool *)((long)p + -3) = false;
  *(bool *)((long)p + -2) = false;
  *(bool *)((long)p + -1) = false;
  local_1a0 = span<bool>::begin(psVar5);
  psVar5 = local_1a8;
  *(bool *)((long)p + -8) = true;
  *(bool *)((long)p + -7) = true;
  *(bool *)((long)p + -6) = true;
  *(bool *)((long)p + -5) = false;
  *(bool *)((long)p + -4) = false;
  *(bool *)((long)p + -3) = false;
  *(bool *)((long)p + -2) = false;
  *(bool *)((long)p + -1) = false;
  pbVar20 = span<bool>::end(psVar5);
  pbVar19 = local_1a0;
  local_89 = false;
  *(bool *)((long)p + -8) = true;
  *(bool *)((long)p + -7) = true;
  *(bool *)((long)p + -6) = true;
  *(bool *)((long)p + -5) = false;
  *(bool *)((long)p + -4) = false;
  *(bool *)((long)p + -3) = false;
  *(bool *)((long)p + -2) = false;
  *(bool *)((long)p + -1) = false;
  ::std::fill<bool*,bool>(pbVar19,pbVar20,&local_89);
  *(bool *)((long)p + -8) = true;
  *(bool *)((long)p + -7) = true;
  *(bool *)((long)p + -6) = true;
  *(bool *)((long)p + -5) = false;
  *(bool *)((long)p + -4) = false;
  *(bool *)((long)p + -3) = false;
  *(bool *)((long)p + -2) = false;
  *(bool *)((long)p + -1) = false;
  set_block_hash_result::set_block_hash_result((set_block_hash_result *)auStack_a8,unknown);
  sVar4.num_verified = last_result.status;
  sVar4.status = (result)auStack_a8;
  sVar4.first_verified_block = i;
  sVar3.num_verified = result.status;
  sVar3.status = local_bc._0_4_;
  sVar3.first_verified_block = local_bc._4_4_;
  sVar2.num_verified = local_c8;
  sVar2.status = rStack_d0;
  sVar2.first_verified_block = first_block;
  sVar24.num_verified = local_1d4;
  sVar24.status = local_1d0.status;
  sVar24.first_verified_block = local_1d0.first_verified_block;
  result.num_verified = 0;
  do {
    last_result.status = sVar4.num_verified;
    _auStack_a8 = sVar4._0_8_;
    uVar11 = _auStack_a8;
    result.status = sVar3.num_verified;
    local_bc = sVar3._0_8_;
    local_1d4 = sVar24.num_verified;
    local_1d0._0_8_ = sVar24._0_8_;
    _rStack_d0 = sVar2;
    if (iVar14 <= result.num_verified) {
      auStack_a8 = (undefined1  [4])sVar4.status;
      if (auStack_a8 == (undefined1  [4])0x3) {
        _auStack_a8 = uVar11;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        boost::logic::tribool::tribool((tribool *)((long)&__range3 + 4),false);
        pVar8.m_val = block_hashes_local.m_len._0_4_;
        iVar14 = (int)block_passed.m_len;
        local_2c.value = __range3._4_4_;
        __end3.m_idx.m_val =
             (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
             (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
             block_hashes_local.m_len._0_4_;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_210 = set_block_hash_result::piece_range
                              ((set_block_hash_result *)auStack_a8,pVar8,iVar14);
        ___begin3 = local_210;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_214.m_val =
             (int)index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                           *)&__begin3);
        local_148 = (index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                     )local_214.m_val;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        iVar15 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                 ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                        *)&__begin3);
        local_218 = iVar15.m_idx.m_val;
        while( true ) {
          iVar10.m_idx.m_val = local_148.m_idx.m_val;
          verified_piece_1.m_val = (int)local_148.m_idx.m_val;
          local_154 = iVar15.m_idx.m_val;
          *(bool *)((long)p + -8) = true;
          *(bool *)((long)p + -7) = true;
          *(bool *)((long)p + -6) = true;
          *(bool *)((long)p + -5) = false;
          *(bool *)((long)p + -4) = false;
          *(bool *)((long)p + -3) = false;
          *(bool *)((long)p + -2) = false;
          *(bool *)((long)p + -1) = false;
          local_219 = libtorrent::operator!=(iVar10,iVar15);
          sVar4.num_verified = last_result.status;
          sVar4.status = (result)auStack_a8;
          sVar4.first_verified_block = i;
          sVar3.num_verified = result.status;
          sVar3.status = local_bc._0_4_;
          sVar3.first_verified_block = local_bc._4_4_;
          sVar24.num_verified = local_1d4;
          sVar24.status = local_1d0.status;
          sVar24.first_verified_block = local_1d0.first_verified_block;
          if (!(bool)local_219) break;
          *(bool *)((long)p + -8) = true;
          *(bool *)((long)p + -7) = true;
          *(bool *)((long)p + -6) = true;
          *(bool *)((long)p + -5) = false;
          *(bool *)((long)p + -4) = false;
          *(bool *)((long)p + -3) = false;
          *(bool *)((long)p + -2) = false;
          *(bool *)((long)p + -1) = false;
          local_220 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                           ::operator*(&local_148);
          ptVar7 = local_190;
          local_158 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)local_220;
          *(bool *)((long)p + -8) = true;
          *(bool *)((long)p + -7) = true;
          *(bool *)((long)p + -6) = true;
          *(bool *)((long)p + -5) = false;
          *(bool *)((long)p + -4) = false;
          *(bool *)((long)p + -3) = false;
          *(bool *)((long)p + -2) = false;
          *(bool *)((long)p + -1) = false;
          local_221 = has_picker(ptVar7);
          if ((bool)local_221) {
            *(bool *)((long)p + -8) = true;
            *(bool *)((long)p + -7) = true;
            *(bool *)((long)p + -6) = true;
            *(bool *)((long)p + -5) = false;
            *(bool *)((long)p + -4) = false;
            *(bool *)((long)p + -3) = false;
            *(bool *)((long)p + -2) = false;
            *(bool *)((long)p + -1) = false;
            local_222 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                                  (&local_158,
                                   (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                   &block_hashes_local.m_len);
            if (!(bool)local_222) {
              ptVar23 = &local_190->super_torrent_hot_members;
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              ppVar22 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&ptVar23->m_picker);
              sVar9.m_val = local_158.m_val;
              local_15c = local_158.m_val;
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              piece_picker::we_dont_have(ppVar22,(piece_index_t)sVar9.m_val);
              ptVar7 = local_190;
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              update_gauge(ptVar7);
              local_160.m_val = local_158.m_val;
              local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_230 = &local_178;
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              ::std::vector<int,_std::allocator<int>_>::vector(&local_178);
              pVar8.m_val = local_160.m_val;
              ptVar7 = local_190;
              blocks = local_230;
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              piece_failed(ptVar7,pVar8,blocks);
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              ::std::vector<int,_std::allocator<int>_>::~vector(&local_178);
            }
          }
          *(bool *)((long)p + -8) = true;
          *(bool *)((long)p + -7) = true;
          *(bool *)((long)p + -6) = true;
          *(bool *)((long)p + -5) = false;
          *(bool *)((long)p + -4) = false;
          *(bool *)((long)p + -3) = false;
          *(bool *)((long)p + -2) = false;
          *(bool *)((long)p + -1) = false;
          local_234.m_val =
               (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                    ::operator++(&local_148);
          local_17c.m_val = local_234.m_val;
        }
      }
      tVar12.value = local_2c.value;
      last_result.status = sVar4.num_verified;
      _auStack_a8 = sVar4._0_8_;
      result.status = sVar3.num_verified;
      local_bc = sVar3._0_8_;
      local_1d4 = sVar24.num_verified;
      local_1d0._0_8_ = sVar24._0_8_;
      local_180 = local_2c.value;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      bVar13 = boost::logic::indeterminate(tVar12.value);
      if (bVar13) {
        local_248 = (span<bool> *)&TORRENT_ALLOCA_size;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_240 = span<bool>::begin((span<bool> *)&TORRENT_ALLOCA_size);
        psVar5 = local_248;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        pbVar20 = span<bool>::end(psVar5);
        pbVar19 = local_240;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_235 = ::std::
                    all_of<bool*,libtorrent::aux::torrent::on_blocks_hashed(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::span<libtorrent::digest32<256l>const>)::__0>
                              (pbVar19,pbVar20);
        if ((bool)local_235) {
          *(bool *)((long)p + -8) = true;
          *(bool *)((long)p + -7) = true;
          *(bool *)((long)p + -6) = true;
          *(bool *)((long)p + -5) = false;
          *(bool *)((long)p + -4) = false;
          *(bool *)((long)p + -3) = false;
          *(bool *)((long)p + -2) = false;
          *(bool *)((long)p + -1) = false;
          boost::logic::tribool::tribool(local_188,true);
          local_2c.value = local_188[0].value;
        }
      }
      block_hashes_local.m_len._4_4_ = local_2c.value;
LAB_00676aea:
      result.first_verified_block = 1;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      alloca_destructor<bool>::~alloca_destructor((alloca_destructor<bool> *)local_88);
      return (tribool)block_hashes_local.m_len._4_4_;
    }
    lVar17 = (long)result.num_verified;
    *(bool *)((long)p + -8) = true;
    *(bool *)((long)p + -7) = true;
    *(bool *)((long)p + -6) = true;
    *(bool *)((long)p + -5) = false;
    *(bool *)((long)p + -4) = false;
    *(bool *)((long)p + -3) = false;
    *(bool *)((long)p + -2) = false;
    *(bool *)((long)p + -1) = false;
    pdVar21 = span<const_libtorrent::digest32<256L>_>::operator[]
                        ((span<const_libtorrent::digest32<256L>_> *)&this_local,lVar17);
    local_1b0 = pdVar21;
    *(bool *)((long)p + -8) = false;
    *(bool *)((long)p + -7) = true;
    *(bool *)((long)p + -6) = true;
    *(bool *)((long)p + -5) = false;
    *(bool *)((long)p + -4) = false;
    *(bool *)((long)p + -3) = false;
    *(bool *)((long)p + -2) = false;
    *(bool *)((long)p + -1) = false;
    bVar13 = digest32<256L>::is_all_zeros(pdVar21);
    ptVar7 = local_190;
    if (bVar13) {
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      boost::logic::tribool::tribool((tribool *)((long)&block_hashes_local.m_len + 4),false);
      goto LAB_00676aea;
    }
    *(bool *)((long)p + -8) = true;
    *(bool *)((long)p + -7) = true;
    *(bool *)((long)p + -6) = true;
    *(bool *)((long)p + -5) = false;
    *(bool *)((long)p + -4) = false;
    *(bool *)((long)p + -3) = false;
    *(bool *)((long)p + -2) = false;
    *(bool *)((long)p + -1) = false;
    local_1b8 = get_hash_picker(ptVar7);
    local_c0.m_val = block_hashes_local.m_len._0_4_;
    lVar17 = (long)result.num_verified;
    local_1c4 = result.num_verified << 0xe;
    *(bool *)((long)p + -8) = true;
    *(bool *)((long)p + -7) = true;
    *(bool *)((long)p + -6) = true;
    *(bool *)((long)p + -5) = false;
    *(bool *)((long)p + -4) = false;
    *(bool *)((long)p + -3) = false;
    *(bool *)((long)p + -2) = false;
    *(bool *)((long)p + -1) = false;
    pdVar21 = span<const_libtorrent::digest32<256L>_>::operator[]
                        ((span<const_libtorrent::digest32<256L>_> *)&this_local,lVar17);
    pVar8.m_val = local_c0.m_val;
    this_00 = local_1b8;
    iVar6 = local_1c4;
    local_1c0 = pdVar21;
    *(bool *)((long)p + -8) = true;
    *(bool *)((long)p + -7) = true;
    *(bool *)((long)p + -6) = true;
    *(bool *)((long)p + -5) = false;
    *(bool *)((long)p + -4) = false;
    *(bool *)((long)p + -3) = false;
    *(bool *)((long)p + -2) = false;
    *(bool *)((long)p + -1) = false;
    sVar24 = hash_picker::set_block_hash(this_00,pVar8,iVar6,pdVar21);
    local_1d4 = sVar24.num_verified;
    local_1d0._0_8_ = sVar24._0_8_;
    local_bc._0_4_ = sVar24.status;
    _rStack_d0 = local_1d0._0_8_;
    local_c8 = local_1d4;
    local_bc = (undefined1  [8])local_1d0._0_8_;
    result.status = local_1d4;
    _auStack_a8 = local_1d0._0_8_;
    last_result.status = local_1d4;
    if (local_bc._0_4_ == success) {
      local_d8 = 0;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      local_1e0 = ::std::max<int>(&local_d8,(int *)(local_bc + 4));
      count = *local_1e0;
      local_e0 = iVar14 - count;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      local_1e8 = ::std::min<int>(&local_e0,(int *)&result);
      local_dc = *local_1e8;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      pbVar19 = span<bool>::begin((span<bool> *)&TORRENT_ALLOCA_size);
      iVar6 = local_dc;
      lVar17 = (long)count;
      __range4._7_1_ = 1;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      ::std::fill_n<bool*,int,bool>(pbVar19 + lVar17,iVar6,(bool *)((long)&__range4 + 7));
      pVar8.m_val = block_hashes_local.m_len._0_4_;
      iVar6 = (int)block_passed.m_len;
      __end4.m_idx.m_val =
           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
           block_hashes_local.m_len._0_4_;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      local_1f0 = set_block_hash_result::piece_range((set_block_hash_result *)local_bc,pVar8,iVar6);
      ___begin4 = local_1f0;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      local_1f4.m_val =
           (int)index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                         *)&__begin4);
      local_100 = (index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   )local_1f4.m_val;
      *(bool *)((long)p + -8) = true;
      *(bool *)((long)p + -7) = true;
      *(bool *)((long)p + -6) = true;
      *(bool *)((long)p + -5) = false;
      *(bool *)((long)p + -4) = false;
      *(bool *)((long)p + -3) = false;
      *(bool *)((long)p + -2) = false;
      *(bool *)((long)p + -1) = false;
      iVar15 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
               ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                      *)&__begin4);
      local_1f8 = iVar15.m_idx.m_val;
      while( true ) {
        iVar10.m_idx.m_val = local_100.m_idx.m_val;
        verified_piece.m_val = (int)local_100.m_idx.m_val;
        local_10c = iVar15.m_idx.m_val;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_1f9 = libtorrent::operator!=(iVar10,iVar15);
        sVar4.num_verified = last_result.status;
        sVar4.status = (result)auStack_a8;
        sVar4.first_verified_block = i;
        sVar3.num_verified = result.status;
        sVar3.status = local_bc._0_4_;
        sVar3.first_verified_block = local_bc._4_4_;
        sVar2.num_verified = local_c8;
        sVar2.status = rStack_d0;
        sVar2.first_verified_block = first_block;
        sVar24.num_verified = local_1d4;
        sVar24.status = local_1d0.status;
        sVar24.first_verified_block = local_1d0.first_verified_block;
        if (!(bool)local_1f9) break;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_200 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                         ::operator*(&local_100);
        ptVar7 = local_190;
        local_110 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)local_200;
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_201 = has_picker(ptVar7);
        if ((bool)local_201) {
          *(bool *)((long)p + -8) = true;
          *(bool *)((long)p + -7) = true;
          *(bool *)((long)p + -6) = true;
          *(bool *)((long)p + -5) = false;
          *(bool *)((long)p + -4) = false;
          *(bool *)((long)p + -3) = false;
          *(bool *)((long)p + -2) = false;
          *(bool *)((long)p + -1) = false;
          local_202 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                                (&local_110,
                                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                 &block_hashes_local.m_len);
          if (!(bool)local_202) {
            ptVar23 = &local_190->super_torrent_hot_members;
            *(bool *)((long)p + -8) = false;
            *(bool *)((long)p + -7) = true;
            *(bool *)((long)p + -6) = true;
            *(bool *)((long)p + -5) = false;
            *(bool *)((long)p + -4) = false;
            *(bool *)((long)p + -3) = false;
            *(bool *)((long)p + -2) = false;
            *(bool *)((long)p + -1) = false;
            ppVar22 = ::std::
                      unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                      ::operator->(&ptVar23->m_picker);
            sVar9.m_val = local_110.m_val;
            local_114 = local_110.m_val;
            *(bool *)((long)p + -8) = true;
            *(bool *)((long)p + -7) = true;
            *(bool *)((long)p + -6) = true;
            *(bool *)((long)p + -5) = false;
            *(bool *)((long)p + -4) = false;
            *(bool *)((long)p + -3) = false;
            *(bool *)((long)p + -2) = false;
            *(bool *)((long)p + -1) = false;
            local_203 = piece_picker::is_piece_finished(ppVar22,(piece_index_t)sVar9.m_val);
            if ((bool)local_203) {
              ptVar23 = &local_190->super_torrent_hot_members;
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              ppVar22 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&ptVar23->m_picker);
              sVar9.m_val = local_110.m_val;
              local_118 = local_110.m_val;
              *(bool *)((long)p + -8) = true;
              *(bool *)((long)p + -7) = true;
              *(bool *)((long)p + -6) = true;
              *(bool *)((long)p + -5) = false;
              *(bool *)((long)p + -4) = false;
              *(bool *)((long)p + -3) = false;
              *(bool *)((long)p + -2) = false;
              *(bool *)((long)p + -1) = false;
              local_204 = piece_picker::has_piece_passed(ppVar22,(piece_index_t)sVar9.m_val);
              if (!(bool)local_204) {
                ptVar23 = &local_190->super_torrent_hot_members;
                *(bool *)((long)p + -8) = true;
                *(bool *)((long)p + -7) = true;
                *(bool *)((long)p + -6) = true;
                *(bool *)((long)p + -5) = false;
                *(bool *)((long)p + -4) = false;
                *(bool *)((long)p + -3) = false;
                *(bool *)((long)p + -2) = false;
                *(bool *)((long)p + -1) = false;
                ppVar22 = ::std::
                          unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ::operator->(&ptVar23->m_picker);
                sVar9.m_val = local_110.m_val;
                local_11c = local_110.m_val;
                *(bool *)((long)p + -8) = true;
                *(bool *)((long)p + -7) = true;
                *(bool *)((long)p + -6) = true;
                *(bool *)((long)p + -5) = false;
                *(bool *)((long)p + -4) = false;
                *(bool *)((long)p + -3) = false;
                *(bool *)((long)p + -2) = false;
                *(bool *)((long)p + -1) = false;
                piece_picker::we_have(ppVar22,(piece_index_t)sVar9.m_val);
                ptVar7 = local_190;
                *(bool *)((long)p + -8) = true;
                *(bool *)((long)p + -7) = true;
                *(bool *)((long)p + -6) = true;
                *(bool *)((long)p + -5) = false;
                *(bool *)((long)p + -4) = false;
                *(bool *)((long)p + -3) = false;
                *(bool *)((long)p + -2) = false;
                *(bool *)((long)p + -1) = false;
                update_gauge(ptVar7);
                sVar9.m_val = local_110.m_val;
                ptVar7 = local_190;
                local_120 = local_110.m_val;
                *(bool *)((long)p + -8) = true;
                *(bool *)((long)p + -7) = true;
                *(bool *)((long)p + -6) = true;
                *(bool *)((long)p + -5) = false;
                *(bool *)((long)p + -4) = false;
                *(bool *)((long)p + -3) = false;
                *(bool *)((long)p + -2) = false;
                *(bool *)((long)p + -1) = false;
                we_have(ptVar7,(piece_index_t)sVar9.m_val,false);
              }
            }
          }
        }
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        local_208.m_val =
             (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  ::operator++(&local_100);
        local_124.m_val = local_208.m_val;
      }
    }
    else {
      sVar2 = sVar24;
      sVar3 = sVar24;
      sVar4 = sVar24;
      if (local_bc._0_4_ == block_hash_failed) {
        *(bool *)((long)p + -8) = true;
        *(bool *)((long)p + -7) = true;
        *(bool *)((long)p + -6) = true;
        *(bool *)((long)p + -5) = false;
        *(bool *)((long)p + -4) = false;
        *(bool *)((long)p + -3) = false;
        *(bool *)((long)p + -2) = false;
        *(bool *)((long)p + -1) = false;
        boost::logic::tribool::tribool(&local_128,false);
        sVar4.num_verified = last_result.status;
        sVar4.status = (result)auStack_a8;
        sVar4.first_verified_block = i;
        sVar3.num_verified = result.status;
        sVar3.status = local_bc._0_4_;
        sVar3.first_verified_block = local_bc._4_4_;
        sVar2.num_verified = local_c8;
        sVar2.status = rStack_d0;
        sVar2.first_verified_block = first_block;
        sVar24.num_verified = local_1d4;
        sVar24.status = local_1d0.status;
        sVar24.first_verified_block = local_1d0.first_verified_block;
        local_2c.value = local_128.value;
      }
    }
    result.num_verified = result.num_verified + 1;
  } while( true );
}

Assistant:

boost::tribool torrent::on_blocks_hashed(piece_index_t const piece
		, span<sha256_hash const> const block_hashes)
	{
		boost::tribool ret = boost::indeterminate;
		need_hash_picker();

		int const blocks_in_piece = torrent_file().orig_files().blocks_in_piece2(piece);
		int const blocks_per_piece = torrent_file().blocks_per_piece();

		// the blocks are guaranteed to represent exactly one piece
		TORRENT_ASSERT(blocks_in_piece == int(block_hashes.size()));

		TORRENT_ALLOCA(block_passed, bool, blocks_in_piece);
		std::fill(block_passed.begin(), block_passed.end(), false);

		auto last_result = set_block_hash_result(set_block_hash_result::result::unknown);

		for (int i = 0; i < blocks_in_piece; ++i)
		{
			// if there was an enoent or eof error the block hashes array may be incomplete
			// bail if we've hit the end of the valid hashes
			if (block_hashes[i].is_all_zeros()) return false;

			auto const result = get_hash_picker().set_block_hash(piece
				, i * default_block_size, block_hashes[i]);
			last_result = result;

			// all verified ranges should always be full pieces or less
			TORRENT_ASSERT(result.first_verified_block >= 0
				|| (result.first_verified_block % blocks_per_piece) == 0);
			TORRENT_ASSERT(result.num_verified <= blocks_per_piece
				|| (result.num_verified % blocks_per_piece) == 0);

			if (result.status == set_block_hash_result::result::success)
			{
				TORRENT_ASSERT(result.first_verified_block < blocks_in_piece);
				TORRENT_ASSERT(blocks_in_piece <= blocks_per_piece);

				// note that result.num_verified may cover pad blocks too, and
				// so may be > blocks_in_piece

				// sometimes, completing a single block may "unlock" validating
				// multiple pieces. e.g. if we don't have the piece layer yet,
				// but we completed the last block in the whole torrent, now we
				// can validate everything. For this reason,
				// first_verified_block may be negative.

				// In this call, we track the blocks in this piece though, in
				// the block_passed array. For that tracking we need to clamp
				// the start index to 0.
				auto const first_block = std::max(0, result.first_verified_block);
				auto const count = std::min(blocks_in_piece - first_block, result.num_verified);
				std::fill_n(block_passed.begin() + first_block, count, true);

				// the current block (i) should be part of the range that was
				// verified
				TORRENT_ASSERT(first_block <= i);
				TORRENT_ASSERT(i < first_block + count);

				// if the hashes for more than one piece have been verified,
				// check for any pieces which were already checked but couldn't
				// be verified and mark them as verified
				for (piece_index_t verified_piece : result.piece_range(piece, blocks_per_piece))
				{
					if (!has_picker()
						|| verified_piece == piece
						|| !m_picker->is_piece_finished(verified_piece)
						|| m_picker->has_piece_passed(verified_piece))
						continue;

					TORRENT_ASSERT(get_hash_picker().piece_verified(verified_piece));
					m_picker->we_have(verified_piece);
					update_gauge();
					we_have(verified_piece);
				}
			}
			else if (result.status == set_block_hash_result::result::block_hash_failed)
			{
				ret = false;
			}
		}
		if (last_result.status == set_block_hash_result::result::piece_hash_failed)
		{
			// only if the *last* block causes the piece to fail, do we know
			// it actually failed. Otherwise it might have been failing
			// because of other, previously existing block hashes.
			ret = false;

			// if the hashes for more than one piece have been verified,
			// check for any pieces which were already checked but couldn't
			// be verified and mark them as verified
			for (piece_index_t verified_piece : last_result.piece_range(piece, blocks_per_piece))
			{
				if (!has_picker()
					|| verified_piece == piece)
					continue;

				m_picker->we_dont_have(verified_piece);
				update_gauge();
				piece_failed(verified_piece);
			}
		}

		if (boost::indeterminate(ret) && std::all_of(block_passed.begin(), block_passed.end()
			, [](bool e) { return e; }))
		{
			ret = true;
		}
		return ret;
	}